

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O1

int run_test_tcp_bind_error_addrnotavail_2(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 unaff_RBX;
  long *plVar3;
  int64_t eval_b;
  int64_t eval_b_1;
  sockaddr_in addr;
  uv_tcp_t server;
  long alStack_998 [4];
  undefined1 auStack_978 [216];
  code *pcStack_8a0;
  long lStack_890;
  long lStack_888;
  long alStack_880 [11];
  undefined1 auStack_828 [16];
  long alStack_818 [25];
  undefined1 auStack_750 [16];
  long alStack_740 [27];
  code *pcStack_668;
  long lStack_658;
  long lStack_650;
  undefined1 auStack_648 [216];
  code *pcStack_570;
  long lStack_560;
  long lStack_558;
  undefined1 auStack_550 [16];
  long alStack_540 [27];
  code *pcStack_468;
  long lStack_458;
  long lStack_450;
  undefined1 auStack_448 [16];
  long alStack_438 [27];
  code *pcStack_360;
  long lStack_350;
  long lStack_348;
  undefined8 auStack_340 [2];
  undefined1 auStack_330 [16];
  long alStack_320 [27];
  code *pcStack_248;
  long lStack_240;
  long lStack_238;
  char acStack_230 [72];
  undefined1 auStack_1e8 [216];
  code *pcStack_110;
  long local_100;
  long local_f8;
  undefined1 local_f0 [16];
  long local_e0 [27];
  
  pcStack_110 = (code *)0x1c6431;
  iVar1 = uv_ip4_addr("4.4.4.4",0x23a3,local_f0);
  local_e0[0] = (long)iVar1;
  local_100 = 0;
  if (local_e0[0] == 0) {
    pcStack_110 = (code *)0x1c6456;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1c6463;
    iVar1 = uv_tcp_init(uVar2,local_e0);
    local_100 = (long)iVar1;
    local_f8 = 0;
    if (local_100 != 0) goto LAB_001c6564;
    pcStack_110 = (code *)0x1c6494;
    iVar1 = uv_tcp_bind(local_e0,local_f0,0);
    local_100 = (long)iVar1;
    local_f8 = -99;
    if (local_100 != -99) goto LAB_001c6573;
    pcStack_110 = (code *)0x1c64c5;
    uv_close(local_e0,close_cb);
    pcStack_110 = (code *)0x1c64ca;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1c64d4;
    uv_run(uVar2,0);
    local_100 = 1;
    local_f8 = (long)close_cb_called;
    if (local_f8 != 1) goto LAB_001c6582;
    pcStack_110 = (code *)0x1c64fe;
    unaff_RBX = uv_default_loop();
    pcStack_110 = (code *)0x1c6512;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_110 = (code *)0x1c651c;
    uv_run(unaff_RBX,0);
    local_100 = 0;
    pcStack_110 = (code *)0x1c652a;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1c6532;
    iVar1 = uv_loop_close(uVar2);
    local_f8 = (long)iVar1;
    if (local_100 == local_f8) {
      pcStack_110 = (code *)0x1c654a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_110 = (code *)0x1c6564;
    run_test_tcp_bind_error_addrnotavail_2_cold_1();
LAB_001c6564:
    pcStack_110 = (code *)0x1c6573;
    run_test_tcp_bind_error_addrnotavail_2_cold_2();
LAB_001c6573:
    pcStack_110 = (code *)0x1c6582;
    run_test_tcp_bind_error_addrnotavail_2_cold_3();
LAB_001c6582:
    pcStack_110 = (code *)0x1c6591;
    run_test_tcp_bind_error_addrnotavail_2_cold_4();
  }
  pcStack_110 = run_test_tcp_bind_error_fault;
  run_test_tcp_bind_error_addrnotavail_2_cold_5();
  builtin_strncpy(acStack_230 + 0x30,"h blah blah",0xc);
  builtin_strncpy(acStack_230 + 0x20,"ah blah blah bla",0x10);
  builtin_strncpy(acStack_230 + 0x10,"lah blah blah bl",0x10);
  builtin_strncpy(acStack_230,"blah blah blah b",0x10);
  pcStack_248 = (code *)0x1c65dd;
  pcStack_110 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_248 = (code *)0x1c65ea;
  iVar1 = uv_tcp_init(uVar2,auStack_1e8);
  lStack_238 = (long)iVar1;
  lStack_240 = 0;
  if (lStack_238 == 0) {
    pcStack_248 = (code *)0x1c6619;
    iVar1 = uv_tcp_bind(auStack_1e8,acStack_230,0);
    lStack_238 = (long)iVar1;
    lStack_240 = -0x16;
    if (lStack_238 != -0x16) goto LAB_001c66dd;
    pcStack_248 = (code *)0x1c6648;
    uv_close(auStack_1e8,close_cb);
    pcStack_248 = (code *)0x1c664d;
    uVar2 = uv_default_loop();
    pcStack_248 = (code *)0x1c6657;
    uv_run(uVar2,0);
    lStack_238 = 1;
    lStack_240 = (long)close_cb_called;
    if (lStack_240 != 1) goto LAB_001c66ea;
    pcStack_248 = (code *)0x1c667b;
    unaff_RBX = uv_default_loop();
    pcStack_248 = (code *)0x1c668f;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_248 = (code *)0x1c6699;
    uv_run(unaff_RBX,0);
    lStack_238 = 0;
    pcStack_248 = (code *)0x1c66a7;
    uVar2 = uv_default_loop();
    pcStack_248 = (code *)0x1c66af;
    iVar1 = uv_loop_close(uVar2);
    lStack_240 = (long)iVar1;
    if (lStack_238 == lStack_240) {
      pcStack_248 = (code *)0x1c66c5;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_248 = (code *)0x1c66dd;
    run_test_tcp_bind_error_fault_cold_1();
LAB_001c66dd:
    pcStack_248 = (code *)0x1c66ea;
    run_test_tcp_bind_error_fault_cold_2();
LAB_001c66ea:
    pcStack_248 = (code *)0x1c66f7;
    run_test_tcp_bind_error_fault_cold_3();
  }
  pcStack_248 = run_test_tcp_bind_error_inval;
  run_test_tcp_bind_error_fault_cold_4();
  pcStack_360 = (code *)0x1c6722;
  pcStack_248 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_330);
  alStack_320[0] = (long)iVar1;
  auStack_340[0] = 0;
  if (alStack_320[0] == 0) {
    pcStack_360 = (code *)0x1c6758;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a4,auStack_340);
    alStack_320[0] = (long)iVar1;
    lStack_350 = 0;
    if (alStack_320[0] != 0) goto LAB_001c68bc;
    pcStack_360 = (code *)0x1c677d;
    uVar2 = uv_default_loop();
    pcStack_360 = (code *)0x1c678a;
    iVar1 = uv_tcp_init(uVar2,alStack_320);
    lStack_350 = (long)iVar1;
    lStack_348 = 0;
    if (lStack_350 != 0) goto LAB_001c68cb;
    pcStack_360 = (code *)0x1c67bb;
    iVar1 = uv_tcp_bind(alStack_320,auStack_330,0);
    lStack_350 = (long)iVar1;
    lStack_348 = 0;
    if (lStack_350 != 0) goto LAB_001c68da;
    pcStack_360 = (code *)0x1c67ec;
    iVar1 = uv_tcp_bind(alStack_320,auStack_340,0);
    lStack_350 = (long)iVar1;
    lStack_348 = -0x16;
    if (lStack_350 != -0x16) goto LAB_001c68e9;
    pcStack_360 = (code *)0x1c681d;
    uv_close(alStack_320,close_cb);
    pcStack_360 = (code *)0x1c6822;
    uVar2 = uv_default_loop();
    pcStack_360 = (code *)0x1c682c;
    uv_run(uVar2,0);
    lStack_350 = 1;
    lStack_348 = (long)close_cb_called;
    if (lStack_348 != 1) goto LAB_001c68f8;
    pcStack_360 = (code *)0x1c6856;
    unaff_RBX = uv_default_loop();
    pcStack_360 = (code *)0x1c686a;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_360 = (code *)0x1c6874;
    uv_run(unaff_RBX,0);
    lStack_350 = 0;
    pcStack_360 = (code *)0x1c6882;
    uVar2 = uv_default_loop();
    pcStack_360 = (code *)0x1c688a;
    iVar1 = uv_loop_close(uVar2);
    lStack_348 = (long)iVar1;
    if (lStack_350 == lStack_348) {
      pcStack_360 = (code *)0x1c68a2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_360 = (code *)0x1c68bc;
    run_test_tcp_bind_error_inval_cold_1();
LAB_001c68bc:
    pcStack_360 = (code *)0x1c68cb;
    run_test_tcp_bind_error_inval_cold_2();
LAB_001c68cb:
    pcStack_360 = (code *)0x1c68da;
    run_test_tcp_bind_error_inval_cold_3();
LAB_001c68da:
    pcStack_360 = (code *)0x1c68e9;
    run_test_tcp_bind_error_inval_cold_4();
LAB_001c68e9:
    pcStack_360 = (code *)0x1c68f8;
    run_test_tcp_bind_error_inval_cold_5();
LAB_001c68f8:
    pcStack_360 = (code *)0x1c6907;
    run_test_tcp_bind_error_inval_cold_6();
  }
  pcStack_360 = run_test_tcp_bind_localhost_ok;
  run_test_tcp_bind_error_inval_cold_7();
  pcStack_468 = (code *)0x1c6934;
  pcStack_360 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_448);
  alStack_438[0] = (long)iVar1;
  lStack_458 = 0;
  if (alStack_438[0] == 0) {
    pcStack_468 = (code *)0x1c6959;
    uVar2 = uv_default_loop();
    pcStack_468 = (code *)0x1c6966;
    iVar1 = uv_tcp_init(uVar2,alStack_438);
    lStack_458 = (long)iVar1;
    lStack_450 = 0;
    if (lStack_458 != 0) goto LAB_001c6a1e;
    pcStack_468 = (code *)0x1c6997;
    iVar1 = uv_tcp_bind(alStack_438,auStack_448,0);
    lStack_458 = (long)iVar1;
    lStack_450 = 0;
    if (lStack_458 != 0) goto LAB_001c6a2d;
    pcStack_468 = (code *)0x1c69b8;
    unaff_RBX = uv_default_loop();
    pcStack_468 = (code *)0x1c69cc;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_468 = (code *)0x1c69d6;
    uv_run(unaff_RBX,0);
    lStack_458 = 0;
    pcStack_468 = (code *)0x1c69e4;
    uVar2 = uv_default_loop();
    pcStack_468 = (code *)0x1c69ec;
    iVar1 = uv_loop_close(uVar2);
    lStack_450 = (long)iVar1;
    if (lStack_458 == lStack_450) {
      pcStack_468 = (code *)0x1c6a04;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_468 = (code *)0x1c6a1e;
    run_test_tcp_bind_localhost_ok_cold_1();
LAB_001c6a1e:
    pcStack_468 = (code *)0x1c6a2d;
    run_test_tcp_bind_localhost_ok_cold_2();
LAB_001c6a2d:
    pcStack_468 = (code *)0x1c6a3c;
    run_test_tcp_bind_localhost_ok_cold_3();
  }
  pcStack_468 = run_test_tcp_bind_invalid_flags;
  run_test_tcp_bind_localhost_ok_cold_4();
  pcStack_570 = (code *)0x1c6a69;
  pcStack_468 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_550);
  alStack_540[0] = (long)iVar1;
  lStack_560 = 0;
  if (alStack_540[0] == 0) {
    pcStack_570 = (code *)0x1c6a8e;
    uVar2 = uv_default_loop();
    pcStack_570 = (code *)0x1c6a9b;
    iVar1 = uv_tcp_init(uVar2,alStack_540);
    lStack_560 = (long)iVar1;
    lStack_558 = 0;
    if (lStack_560 != 0) goto LAB_001c6b56;
    pcStack_570 = (code *)0x1c6acf;
    iVar1 = uv_tcp_bind(alStack_540,auStack_550,1);
    lStack_560 = (long)iVar1;
    lStack_558 = -0x16;
    if (lStack_560 != -0x16) goto LAB_001c6b65;
    pcStack_570 = (code *)0x1c6af0;
    unaff_RBX = uv_default_loop();
    pcStack_570 = (code *)0x1c6b04;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_570 = (code *)0x1c6b0e;
    uv_run(unaff_RBX,0);
    lStack_560 = 0;
    pcStack_570 = (code *)0x1c6b1c;
    uVar2 = uv_default_loop();
    pcStack_570 = (code *)0x1c6b24;
    iVar1 = uv_loop_close(uVar2);
    lStack_558 = (long)iVar1;
    if (lStack_560 == lStack_558) {
      pcStack_570 = (code *)0x1c6b3c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_570 = (code *)0x1c6b56;
    run_test_tcp_bind_invalid_flags_cold_1();
LAB_001c6b56:
    pcStack_570 = (code *)0x1c6b65;
    run_test_tcp_bind_invalid_flags_cold_2();
LAB_001c6b65:
    pcStack_570 = (code *)0x1c6b74;
    run_test_tcp_bind_invalid_flags_cold_3();
  }
  pcStack_570 = run_test_tcp_listen_without_bind;
  run_test_tcp_bind_invalid_flags_cold_4();
  pcStack_668 = (code *)0x1c6b90;
  pcStack_570 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_668 = (code *)0x1c6b9d;
  iVar1 = uv_tcp_init(uVar2,auStack_648);
  lStack_650 = (long)iVar1;
  lStack_658 = 0;
  if (lStack_650 == 0) {
    pcStack_668 = (code *)0x1c6bce;
    iVar1 = uv_listen(auStack_648,0x80,0);
    lStack_650 = (long)iVar1;
    lStack_658 = 0;
    if (lStack_650 != 0) goto LAB_001c6c55;
    pcStack_668 = (code *)0x1c6bef;
    unaff_RBX = uv_default_loop();
    pcStack_668 = (code *)0x1c6c03;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_668 = (code *)0x1c6c0d;
    uv_run(unaff_RBX,0);
    lStack_650 = 0;
    pcStack_668 = (code *)0x1c6c1b;
    uVar2 = uv_default_loop();
    pcStack_668 = (code *)0x1c6c23;
    iVar1 = uv_loop_close(uVar2);
    lStack_658 = (long)iVar1;
    if (lStack_650 == lStack_658) {
      pcStack_668 = (code *)0x1c6c3b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_668 = (code *)0x1c6c55;
    run_test_tcp_listen_without_bind_cold_1();
LAB_001c6c55:
    pcStack_668 = (code *)0x1c6c64;
    run_test_tcp_listen_without_bind_cold_2();
  }
  pcStack_668 = run_test_tcp_bind_writable_flags;
  run_test_tcp_listen_without_bind_cold_3();
  pcStack_8a0 = (code *)0x1c6c91;
  pcStack_668 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_828);
  alStack_740[0] = (long)iVar1;
  alStack_818[0] = 0;
  if (alStack_740[0] == 0) {
    pcStack_8a0 = (code *)0x1c6cc2;
    uVar2 = uv_default_loop();
    pcStack_8a0 = (code *)0x1c6cd2;
    iVar1 = uv_tcp_init(uVar2,alStack_740);
    alStack_818[0] = (long)iVar1;
    alStack_880[0] = 0;
    if (alStack_818[0] != 0) goto LAB_001c6f5a;
    pcStack_8a0 = (code *)0x1c6d0c;
    iVar1 = uv_tcp_bind(alStack_740,auStack_828,0);
    alStack_818[0] = (long)iVar1;
    alStack_880[0] = 0;
    if (alStack_818[0] != 0) goto LAB_001c6f6c;
    pcStack_8a0 = (code *)0x1c6d46;
    iVar1 = uv_listen(alStack_740,0x80,0);
    alStack_818[0] = (long)iVar1;
    alStack_880[0] = 0;
    if (alStack_818[0] != 0) goto LAB_001c6f7e;
    pcStack_8a0 = (code *)0x1c6d79;
    iVar1 = uv_is_writable(alStack_740);
    alStack_818[0] = (long)iVar1;
    alStack_880[0] = 0;
    if (alStack_818[0] != 0) goto LAB_001c6f90;
    pcStack_8a0 = (code *)0x1c6dac;
    iVar1 = uv_is_readable(alStack_740);
    alStack_818[0] = (long)iVar1;
    alStack_880[0] = 0;
    if (alStack_818[0] != 0) goto LAB_001c6fa2;
    pcStack_8a0 = (code *)0x1c6de3;
    auStack_750 = uv_buf_init("PING",4);
    pcStack_8a0 = (code *)0x1c6e12;
    iVar1 = uv_write(alStack_818,alStack_740,auStack_750,1,0);
    alStack_880[0] = (long)iVar1;
    lStack_890 = -0x20;
    if (alStack_880[0] != -0x20) goto LAB_001c6fb4;
    pcStack_8a0 = (code *)0x1c6e46;
    iVar1 = uv_shutdown(alStack_880,alStack_740,0);
    lStack_890 = (long)iVar1;
    lStack_888 = -0x6b;
    if (lStack_890 != -0x6b) goto LAB_001c6fc3;
    pcStack_8a0 = (code *)0x1c6e7d;
    iVar1 = uv_read_start(alStack_740,abort);
    lStack_890 = (long)iVar1;
    lStack_888 = -0x6b;
    if (lStack_890 != -0x6b) goto LAB_001c6fd2;
    pcStack_8a0 = (code *)0x1c6eb1;
    uv_close(alStack_740,close_cb);
    pcStack_8a0 = (code *)0x1c6eb6;
    uVar2 = uv_default_loop();
    pcStack_8a0 = (code *)0x1c6ec0;
    uv_run(uVar2,0);
    lStack_890 = 1;
    lStack_888 = (long)close_cb_called;
    if (lStack_888 != 1) goto LAB_001c6fe1;
    pcStack_8a0 = (code *)0x1c6eea;
    unaff_RBX = uv_default_loop();
    pcStack_8a0 = (code *)0x1c6efe;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_8a0 = (code *)0x1c6f08;
    uv_run(unaff_RBX,0);
    lStack_890 = 0;
    pcStack_8a0 = (code *)0x1c6f16;
    uVar2 = uv_default_loop();
    pcStack_8a0 = (code *)0x1c6f1e;
    iVar1 = uv_loop_close(uVar2);
    lStack_888 = (long)iVar1;
    if (lStack_890 == lStack_888) {
      pcStack_8a0 = (code *)0x1c6f3a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_8a0 = (code *)0x1c6f5a;
    run_test_tcp_bind_writable_flags_cold_1();
LAB_001c6f5a:
    pcStack_8a0 = (code *)0x1c6f6c;
    run_test_tcp_bind_writable_flags_cold_2();
LAB_001c6f6c:
    pcStack_8a0 = (code *)0x1c6f7e;
    run_test_tcp_bind_writable_flags_cold_3();
LAB_001c6f7e:
    pcStack_8a0 = (code *)0x1c6f90;
    run_test_tcp_bind_writable_flags_cold_4();
LAB_001c6f90:
    pcStack_8a0 = (code *)0x1c6fa2;
    run_test_tcp_bind_writable_flags_cold_5();
LAB_001c6fa2:
    pcStack_8a0 = (code *)0x1c6fb4;
    run_test_tcp_bind_writable_flags_cold_6();
LAB_001c6fb4:
    pcStack_8a0 = (code *)0x1c6fc3;
    run_test_tcp_bind_writable_flags_cold_7();
LAB_001c6fc3:
    pcStack_8a0 = (code *)0x1c6fd2;
    run_test_tcp_bind_writable_flags_cold_8();
LAB_001c6fd2:
    pcStack_8a0 = (code *)0x1c6fe1;
    run_test_tcp_bind_writable_flags_cold_9();
LAB_001c6fe1:
    pcStack_8a0 = (code *)0x1c6ff0;
    run_test_tcp_bind_writable_flags_cold_10();
  }
  pcStack_8a0 = run_test_tcp_bind_or_listen_error_after_close;
  run_test_tcp_bind_writable_flags_cold_11();
  alStack_998[2] = 0;
  alStack_998[1] = 0xf270002;
  pcStack_8a0 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar2,auStack_978);
  alStack_998[0] = (long)iVar1;
  if (alStack_998[0] == 0) {
    uv_close(auStack_978,0);
    iVar1 = uv_tcp_bind(auStack_978,alStack_998 + 1,0);
    alStack_998[0] = (long)iVar1;
    if (alStack_998[0] != -0x16) goto LAB_001c7146;
    iVar1 = uv_listen(auStack_978,5,0);
    alStack_998[0] = (long)iVar1;
    if (alStack_998[0] != -0x16) goto LAB_001c7153;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    alStack_998[0] = (long)iVar1;
    if (alStack_998[0] == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      alStack_998[0] = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (alStack_998[0] == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c716d;
    }
  }
  else {
    run_test_tcp_bind_or_listen_error_after_close_cold_1();
LAB_001c7146:
    run_test_tcp_bind_or_listen_error_after_close_cold_2();
LAB_001c7153:
    run_test_tcp_bind_or_listen_error_after_close_cold_3();
  }
  run_test_tcp_bind_or_listen_error_after_close_cold_4();
LAB_001c716d:
  plVar3 = alStack_998;
  run_test_tcp_bind_or_listen_error_after_close_cold_5();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_bind_error_addrnotavail_2) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  int r;

  ASSERT_OK(uv_ip4_addr("4.4.4.4", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_EQ(r, UV_EADDRNOTAVAIL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}